

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong __thiscall mkvparser::Cluster::GetTime(Cluster *this)

{
  SegmentInfo *pSVar1;
  long lVar2;
  long len;
  longlong pos;
  long lStack_18;
  longlong local_10;
  
  lVar2 = Load(this,&local_10,&lStack_18);
  if (-1 < lVar2) {
    lVar2 = this->m_timecode;
  }
  if (-1 < lVar2) {
    pSVar1 = this->m_pSegment->m_pInfo;
    if (pSVar1 == (SegmentInfo *)0x0) {
      __assert_fail("pInfo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bb3,"long long mkvparser::Cluster::GetTime() const");
    }
    lVar2 = pSVar1->m_timecodeScale;
    if (lVar2 < 1) {
      __assert_fail("scale >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bb6,"long long mkvparser::Cluster::GetTime() const");
    }
    lVar2 = lVar2 * this->m_timecode;
  }
  return lVar2;
}

Assistant:

long long Cluster::GetTime() const {
  const long long tc = GetTimeCode();

  if (tc < 0)
    return tc;

  const SegmentInfo* const pInfo = m_pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  const long long t = m_timecode * scale;

  return t;
}